

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma.cpp
# Opt level: O0

lzma_stream * stream::init_raw_lzma_stream(lzma_vli filter,lzma_options_lzma *options)

{
  int iVar1;
  undefined8 uVar2;
  long in_RSI;
  undefined8 in_RDI;
  lzma_ret ret;
  lzma_filter filters [2];
  lzma_stream tmp;
  lzma_stream *strm;
  string *msg;
  lzma_stream *this;
  allocator<char> *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff20;
  undefined8 local_c8;
  long local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined1 local_a0 [136];
  lzma_stream *local_18;
  long local_10;
  undefined8 local_8;
  
  *(undefined8 *)(in_RSI + 8) = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_18 = (lzma_stream *)operator_new(0x88);
  memset(local_a0,0,0x88);
  memcpy(local_18,local_a0,0x88);
  local_18->allocator = (lzma_allocator *)0x0;
  local_c8 = local_8;
  local_c0 = local_10;
  local_b8 = 0xffffffffffffffff;
  local_b0 = 0;
  iVar1 = lzma_raw_decoder(local_18,&local_c8);
  if (iVar1 != 0) {
    this = local_18;
    if (local_18 != (lzma_stream *)0x0) {
      operator_delete(local_18,0x88);
    }
    uVar2 = __cxa_allocate_exception(0x28);
    msg = (string *)&stack0xffffffffffffff0f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    lzma_error::lzma_error((lzma_error *)this,msg,(int)((ulong)uVar2 >> 0x20));
    __cxa_throw(uVar2,&lzma_error::typeinfo,slice_error::~slice_error);
  }
  return local_18;
}

Assistant:

static lzma_stream * init_raw_lzma_stream(lzma_vli filter, lzma_options_lzma & options) {
	
	options.preset_dict = NULL;
	
	lzma_stream * strm = new lzma_stream;
	lzma_stream tmp = LZMA_STREAM_INIT;
	*strm = tmp;
	strm->allocator = NULL;
	
	const lzma_filter filters[2] = { { filter,  &options }, { LZMA_VLI_UNKNOWN, NULL } };
	lzma_ret ret = lzma_raw_decoder(strm, filters);
	if(ret != LZMA_OK) {
		delete strm;
		throw lzma_error("inno lzma init error", ret);
	}
	
	return strm;
}